

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O1

void __thiscall
Animation_Constraint::Changed
          (Animation_Constraint *this,Am_Slot *slot,Am_Constraint *invalidating_constraint,
          Am_Value *param_3,Am_Value *new_value)

{
  bool bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  Am_Explicit_Set *pAVar4;
  uint uVar5;
  Am_Demon_Queue queue;
  Am_Object_Advanced object;
  Am_Demon_Queue AStack_48;
  Am_Object local_40;
  Am_Slot local_38;
  
  Am_Slot::Get_Owner((Am_Slot *)&local_40);
  Am_Object_Advanced::Get_Queue((Am_Object_Advanced *)&AStack_48);
  Am_Demon_Queue::Prevent_Invoke(&AStack_48);
  if ((Animation_Constraint *)invalidating_constraint == this) goto LAB_0019ab82;
  if (this->must_initialize_instance == true) {
    Initialize(this);
  }
  local_38 = Am_Object_Advanced::Get_Slot(&this->interpolator,0xcc);
  pAVar3 = Am_Slot::Get(&local_38);
  bVar1 = Am_Value::Valid(pAVar3);
  if (invalidating_constraint != (Am_Constraint *)0x0) {
    bVar2 = Am_Explicit_Set::Test(invalidating_constraint);
    if (bVar2) {
      pAVar4 = Am_Explicit_Set::Narrow(invalidating_constraint);
      bVar2 = true;
      uVar5 = (uint)pAVar4->flags;
      if ((uVar5 >> 0x12 & 1) == 0) {
        if ((uVar5 >> 0x11 & 1) == 0) {
          bVar2 = (uVar5 >> 0x13 & 1) == 0;
        }
        else {
          bVar1 = false;
        }
      }
      else {
        bVar1 = true;
      }
      if (!bVar2) goto LAB_0019ab82;
    }
  }
  local_38 = Am_Object_Advanced::Get_Slot(&this->interpolator,0xf7);
  pAVar3 = Am_Slot::Get(&local_38);
  bVar2 = Am_Value::Valid(pAVar3);
  if (bVar2) {
    if (bVar1 == false) {
      this->must_abort_animation = true;
    }
    if (!bVar2) goto LAB_0019ab2f;
LAB_0019ab34:
    if (this->change_enqueued == false) {
      this->change_enqueued = true;
      Am_Demon_Queue::Enqueue(&AStack_48,animator_changed_demon,0,slot);
      Am_Value::operator=(&this->start,&this->target);
    }
  }
  else {
LAB_0019ab2f:
    if (bVar1 != false) goto LAB_0019ab34;
  }
  Set_Target_Value(this,slot,new_value);
  if (bVar1 == false) {
    Am_Value::operator=(&this->start,&this->target);
  }
LAB_0019ab82:
  Am_Demon_Queue::Release_Invoke(&AStack_48);
  Am_Demon_Queue::~Am_Demon_Queue(&AStack_48);
  Am_Object::~Am_Object(&local_40);
  return;
}

Assistant:

void
Animation_Constraint::Changed(const Am_Slot &slot,
                              Am_Constraint *invalidating_constraint,
                              const Am_Value &, const Am_Value &new_value)
{
  Am_Object_Advanced object = slot.Get_Owner();
  Am_Demon_Queue queue = object.Get_Queue();

  queue.Prevent_Invoke();
  // MUST Release_Invoke(), SO DON'T RETURN -- use "goto done" instead

  // std::cout << "Animation_Constraint::Changed " << slot.Get_Key() << ", " <<
  //  invalidating_constraint << ", new value " << new_value <<std::endl;
  if (invalidating_constraint != this) {
    if (must_initialize_instance)
      Initialize();

    // animated: should this change should be animated?
    bool animated = interpolator.Get_Slot(Am_ACTIVE).Get().Valid();
    //bool animated = interpolator.Get (Am_ACTIVE, Am_RETURN_ZERO_ON_ERROR);

    if (invalidating_constraint &&
        Am_Explicit_Set::Test(invalidating_constraint)) {
      Am_Slot_Flags flags =
          Am_Explicit_Set::Narrow(invalidating_constraint)->flags;

      if (flags & Am_WITH_ANIMATION)
        animated = true;
      else if (flags & Am_NO_ANIMATION)
        animated = false;
      else if (flags & Am_DONT_TELL_ANIMATORS)
        goto done; // setter doesn't want us to know (FIX: this could
      // cause inconsistency between animators' Am_VALUE and the slot value)
    }

    // running: is the animator currently running?
    bool running = interpolator.Get_Slot(Am_RUNNING).Get().Valid();
    //bool running = interpolator.Get (Am_RUNNING, Am_RETURN_ZERO_ON_ERROR);

    if (running && !animated)
      // unanimated change which may have to abort a running animation
      must_abort_animation = true;

    if ((running || animated) && !change_enqueued) {
      // put a demon on the queue which will eventually send this change
      // to the animator (unless such a demon is already there)
      change_enqueued = true;
      queue.Enqueue(animator_changed_demon, 0, slot);
      // The which_bit parameter for Enqueue is zero so that
      // when the demon is called it won't affect the demon_bits
      // in the slot.

      // this is the first change (of possibly a series of Sets affecting
      // this constraint).  Initialize the starting value.
      start = target;
    }

    Set_Target_Value(slot, new_value);
    if (!animated)
      start = target;
  }

done:
  queue.Release_Invoke();
}